

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall
flatbuffers::Parser::TryTypedValue
          (Parser *this,string *name,int dtoken,bool check,Value *e,BaseType req,bool *destmatch)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer pcVar1;
  uint *puVar2;
  long *plVar3;
  long lVar4;
  long *plVar5;
  int iVar6;
  undefined7 in_register_00000009;
  long *plVar7;
  size_type *psVar8;
  undefined4 in_register_00000014;
  _Alloc_hider _Var9;
  undefined4 in_register_0000008c;
  char *in_stack_00000010;
  long *local_150;
  long local_140;
  long lStack_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0 [2];
  long local_a0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  long *local_70;
  long local_68;
  long local_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  plVar5 = (long *)CONCAT44(in_register_00000014,dtoken);
  if ((*in_stack_00000010 != '\0') ||
     (iVar6 = (int)CONCAT71(in_register_00000009,check),
     *(int *)((long)&name->field_2 + 0xc) != iVar6)) {
    __assert_fail("*destmatch == false && dtoken == token_",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                  ,0x815,
                  "CheckedError flatbuffers::Parser::TryTypedValue(const std::string *, int, bool, Value &, BaseType, bool *)"
                 );
  }
  puVar2 = (uint *)CONCAT44(in_register_0000008c,req);
  *in_stack_00000010 = '\x01';
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          (CONCAT44(in_register_0000008c,req) + 0x20);
  std::__cxx11::string::_M_assign((string *)__rhs);
  if ((char)e == '\0') {
    if (*puVar2 == 0) {
      *puVar2 = (uint)destmatch;
      goto LAB_00115261;
    }
    local_90[0] = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,"type mismatch: expecting: ","");
    if (0x12 < *puVar2) {
LAB_001157a4:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/idl.h"
                    ,0xaa,"const char *flatbuffers::TypeName(const BaseType)");
    }
    plVar3 = (long *)std::__cxx11::string::append((char *)local_90);
    local_f0 = &local_e0;
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_e0 = *plVar7;
      lStack_d8 = plVar3[3];
    }
    else {
      local_e0 = *plVar7;
      local_f0 = (long *)*plVar3;
    }
    local_e8 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_110 = &local_100;
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_100 = *plVar7;
      lStack_f8 = plVar3[3];
    }
    else {
      local_100 = *plVar7;
      local_110 = (long *)*plVar3;
    }
    local_108 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (0x12 < (uint)destmatch) goto LAB_001157a4;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_d0 = &local_c0;
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_c0 = *plVar7;
      lStack_b8 = plVar3[3];
    }
    else {
      local_c0 = *plVar7;
      local_d0 = (long *)*plVar3;
    }
    local_c8 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_60 = *plVar7;
      uStack_58 = (undefined4)plVar3[3];
      uStack_54 = *(undefined4 *)((long)plVar3 + 0x1c);
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar7;
      local_70 = (long *)*plVar3;
    }
    local_68 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_b0[0] = local_a0;
    if (plVar5 == (long *)0x0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"");
    }
    else {
      std::__cxx11::string::_M_construct<char*>((string *)local_b0,*plVar5,plVar5[1] + *plVar5);
    }
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b0[0]);
    plVar3 = plVar5 + 2;
    if ((long *)*plVar5 == plVar3) {
      local_40 = *plVar3;
      lStack_38 = plVar5[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar3;
      local_50 = (long *)*plVar5;
    }
    local_48 = plVar5[1];
    *plVar5 = (long)plVar3;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_130.field_2._M_allocated_capacity = *psVar8;
      local_130.field_2._8_8_ = plVar5[3];
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar8;
      local_130._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_130._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_130,*(ulong *)(puVar2 + 8));
    plVar3 = plVar5 + 2;
    if ((long *)*plVar5 == plVar3) {
      local_140 = *plVar3;
      lStack_138 = plVar5[3];
      local_150 = &local_140;
    }
    else {
      local_140 = *plVar3;
      local_150 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar3;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    Error(this,name);
    if (local_150 != &local_140) {
      operator_delete(local_150,local_140 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,local_40 + 1);
    }
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0],local_a0[0] + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    _Var9._M_p = (pointer)local_90[0];
    if (local_90[0] == &local_80) goto LAB_001156bf;
  }
  else {
LAB_00115261:
    if ((((iVar6 == 0x103) || (1 < *puVar2 - 0xb)) ||
        (lVar4 = std::__cxx11::string::find_first_of((char *)__rhs,0x150adc,0), lVar4 == -1)) ||
       (((*(ulong *)(puVar2 + 10) <= lVar4 + 1U ||
         (pcVar1 = (__rhs->_M_dataplus)._M_p, pcVar1[lVar4] != '0')) ||
        (((pcVar1[lVar4 + 1U] & 0xdfU) != 0x58 ||
         (lVar4 = std::__cxx11::string::find_first_of((char *)__rhs,0x14fc04,lVar4 + 2), lVar4 != -1
         )))))) {
      Next(this);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
        *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
      }
      goto LAB_001156bf;
    }
    std::operator+(&local_130,
                   "invalid number, the exponent suffix of hexadecimal floating-point literals is mandatory: \""
                   ,__rhs);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
    plVar3 = plVar5 + 2;
    if ((long *)*plVar5 == plVar3) {
      local_140 = *plVar3;
      lStack_138 = plVar5[3];
      local_150 = &local_140;
    }
    else {
      local_140 = *plVar3;
      local_150 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar3;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    Error(this,name);
    if (local_150 != &local_140) {
      operator_delete(local_150,local_140 + 1);
    }
    local_80._M_allocated_capacity = local_130.field_2._M_allocated_capacity;
    _Var9._M_p = local_130._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p == &local_130.field_2) goto LAB_001156bf;
  }
  operator_delete(_Var9._M_p,local_80._M_allocated_capacity + 1);
LAB_001156bf:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::TryTypedValue(const std::string *name, int dtoken,
                                   bool check, Value &e, BaseType req,
                                   bool *destmatch) {
  FLATBUFFERS_ASSERT(*destmatch == false && dtoken == token_);
  *destmatch = true;
  e.constant = attribute_;
  // Check token match
  if (!check) {
    if (e.type.base_type == BASE_TYPE_NONE) {
      e.type.base_type = req;
    } else {
      return Error(std::string("type mismatch: expecting: ") +
                   TypeName(e.type.base_type) + ", found: " + TypeName(req) +
                   ", name: " + (name ? *name : "") + ", value: " + e.constant);
    }
  }
  // The exponent suffix of hexadecimal float-point number is mandatory.
  // A hex-integer constant is forbidden as an initializer of float number.
  if ((kTokenFloatConstant != dtoken) && IsFloat(e.type.base_type)) {
    const auto &s = e.constant;
    const auto k = s.find_first_of("0123456789.");
    if ((std::string::npos != k) && (s.length() > (k + 1)) &&
        (s[k] == '0' && is_alpha_char(s[k + 1], 'X')) &&
        (std::string::npos == s.find_first_of("pP", k + 2))) {
      return Error(
          "invalid number, the exponent suffix of hexadecimal "
          "floating-point literals is mandatory: \"" +
          s + "\"");
    }
  }
  NEXT();
  return NoError();
}